

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

op_t * cast(op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,op_t op,MIR_type_t t,int new_op_p)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined8 uVar3;
  int64_t iVar4;
  char *pcVar5;
  undefined8 uVar6;
  MIR_disp_t MVar7;
  undefined4 uVar8;
  MIR_type_t MVar9;
  MIR_insn_code_t code;
  MIR_insn_t_conflict pMVar10;
  undefined1 uVar11;
  op_t *__return_storage_ptr___00;
  MIR_insn_code_t MVar12;
  MIR_context_t ctx;
  MIR_insn_code_t MVar13;
  op_t local_b8;
  op_t local_78;
  
  uVar8 = op.mir_op.u.reg;
  if (MIR_T_LD < t) {
    __assert_fail("t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16 || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64 || t == MIR_T_F || t == MIR_T_D || t == MIR_T_LD"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x292d,"op_t cast(c2m_ctx_t, op_t, MIR_type_t, int)");
  }
  __return_storage_ptr___00 = &op;
  MVar13 = MIR_INSN_BOUND;
  switch(op.mir_op._8_1_) {
  case (BADTYPE)0x1:
    MVar9 = reg_type(c2m_ctx,op.mir_op.u.reg);
    uVar8 = op.mir_op.u.reg;
    break;
  default:
    goto switchD_001a78ab_caseD_2;
  case (BADTYPE)0x3:
    MVar12 = MIR_EXT16;
    if (t < MIR_T_I16) {
      MVar12 = (uint)(t != MIR_T_I8) * 3 + MIR_EXT8;
    }
    code = MIR_UEXT16;
    if (t < MIR_T_U16) {
      code = MVar12;
    }
    if ((t < MIR_T_I32) || (code = MIR_I2F, t == MIR_T_F)) goto LAB_001a7a81;
    MVar12 = MIR_I2LD;
    if (t != MIR_T_LD) {
      MVar12 = MIR_INSN_BOUND;
    }
    code = MIR_I2D;
    goto LAB_001a7a47;
  case (BADTYPE)0x4:
    MVar12 = MIR_EXT16;
    if (t < MIR_T_I16) {
      MVar12 = (uint)(t != MIR_T_I8) * 3 + MIR_EXT8;
    }
    code = MIR_UEXT16;
    if (t < MIR_T_U16) {
      code = MVar12;
    }
    if ((t < MIR_T_I32) || (code = MIR_UI2F, t == MIR_T_F)) goto LAB_001a7a81;
    MVar12 = MIR_UI2LD;
    if (t != MIR_T_LD) {
      MVar12 = MIR_INSN_BOUND;
    }
    code = MIR_UI2D;
LAB_001a7a47:
    if (t != MIR_T_D) {
      code = MVar12;
    }
    goto LAB_001a7a81;
  case (BADTYPE)0x5:
    goto switchD_001a78ab_caseD_5;
  case (BADTYPE)0x6:
    goto switchD_001a78ab_caseD_6;
  case (BADTYPE)0x7:
    goto switchD_001a78ab_caseD_7;
  case (BADTYPE)0xa:
    MVar9 = MIR_T_UNDEF;
    if (op.mir_op.u.reg._0_1_ != '\x12') {
      uVar11 = 6;
      if (6 < (byte)op.mir_op.u.reg._0_1_) {
        uVar11 = op.mir_op.u.reg._0_1_;
      }
      MVar9 = (MIR_type_t)(byte)uVar11;
    }
  }
  op.mir_op.u.reg = uVar8;
  if ((char)MVar9 == '\b') {
switchD_001a78ab_caseD_5:
    MVar13 = MIR_F2LD;
    if (t != MIR_T_LD) {
      MVar13 = MIR_INSN_BOUND;
    }
    MVar12 = MIR_F2D;
    if (t != MIR_T_D) {
      MVar12 = MVar13;
    }
    code = MIR_F2I;
  }
  else if ((MVar9 & 0xff) == MIR_T_D) {
switchD_001a78ab_caseD_6:
    MVar13 = MIR_D2LD;
    if (t != MIR_T_LD) {
      MVar13 = MIR_INSN_BOUND;
    }
    MVar12 = MIR_D2F;
    if (t != MIR_T_F) {
      MVar12 = MVar13;
    }
    code = MIR_D2I;
  }
  else {
    if ((MVar9 & 0xff) != MIR_T_LD) {
      if (1 < t - MIR_T_I32) {
        if ((t != MIR_T_U64) && (t != MIR_T_I64)) {
          MVar12 = (uint)(t != MIR_T_I8) * 3 + MIR_EXT8;
          if ((t & (MIR_T_BLK|MIR_T_I16)) == MIR_T_I16) {
            MVar12 = (uint)(t != MIR_T_I16) * 3 + MIR_EXT16;
          }
          if (t < MIR_T_I32) {
            code = MIR_INSN_BOUND;
            MVar13 = MVar12;
          }
          else {
            if (t == MIR_T_F) {
              MVar12 = MIR_UEXT32;
              if (MVar9 != MIR_T_U32) {
                MVar12 = MIR_INSN_BOUND;
              }
              MVar13 = MIR_UI2F;
              if ((MVar9 & 0xfd) != MIR_T_U32) {
                MVar13 = MIR_INSN_BOUND;
              }
              code = MIR_EXT32;
              if (MVar9 != MIR_T_I32) {
                code = MVar12;
              }
              MVar12 = MIR_I2F;
            }
            else if (t == MIR_T_D) {
              MVar12 = MIR_UEXT32;
              if (MVar9 != MIR_T_U32) {
                MVar12 = MIR_INSN_BOUND;
              }
              MVar13 = MIR_UI2D;
              if ((MVar9 & 0xfd) != MIR_T_U32) {
                MVar13 = MIR_INSN_BOUND;
              }
              code = MIR_EXT32;
              if (MVar9 != MIR_T_I32) {
                code = MVar12;
              }
              MVar12 = MIR_I2D;
            }
            else {
              code = MIR_INSN_BOUND;
              if (t != MIR_T_LD) goto LAB_001a7a81;
              MVar12 = MIR_UEXT32;
              if (MVar9 != MIR_T_U32) {
                MVar12 = MIR_INSN_BOUND;
              }
              MVar13 = MIR_UI2LD;
              if ((MVar9 & 0xfd) != MIR_T_U32) {
                MVar13 = MIR_INSN_BOUND;
              }
              code = MIR_EXT32;
              if (MVar9 != MIR_T_I32) {
                code = MVar12;
              }
              MVar12 = MIR_I2LD;
            }
            if (MVar9 == MIR_T_I32) {
              MVar13 = MVar12;
            }
            if (MVar9 == MIR_T_I64) {
              MVar13 = MVar12;
            }
          }
          goto LAB_001a7a81;
        }
        if ((char)MVar9 == '\x04') {
          code = MIR_EXT32;
          goto LAB_001a7a81;
        }
        if ((MVar9 & 0xff) == MIR_T_U32) {
          code = MIR_UEXT32;
          goto LAB_001a7a81;
        }
      }
switchD_001a78ab_caseD_2:
      code = MIR_INSN_BOUND;
      goto LAB_001a7a81;
    }
switchD_001a78ab_caseD_7:
    MVar13 = MIR_LD2D;
    if (t != MIR_T_D) {
      MVar13 = MIR_INSN_BOUND;
    }
    MVar12 = MIR_LD2F;
    if (t != MIR_T_F) {
      MVar12 = MVar13;
    }
    code = MIR_LD2I;
  }
  if (MIR_T_U64 < t) {
    code = MVar12;
  }
  if (t < MIR_T_I16) {
    MVar13 = (uint)(t != MIR_T_I8) * 3 + MIR_EXT8;
  }
  else {
    MVar12 = MIR_INSN_BOUND;
    if (t == MIR_T_U16) {
      MVar12 = MIR_UEXT16;
    }
    MVar13 = MIR_EXT16;
    if (t != MIR_T_I16) {
      MVar13 = MVar12;
    }
  }
LAB_001a7a81:
  if (((new_op_p != 0) || (code != MIR_INSN_BOUND)) || (MVar13 != MIR_INSN_BOUND)) {
    MVar9 = MIR_T_I64;
    if (MIR_T_U16 < t) {
      MVar9 = t;
    }
    __return_storage_ptr___00 = &local_b8;
    get_new_temp(__return_storage_ptr___00,c2m_ctx,MVar9);
    if ((code == MIR_INSN_BOUND) && (MVar13 == MIR_INSN_BOUND)) {
      if (t == MIR_T_F) {
        MVar13 = MIR_FMOV;
      }
      else if (t == MIR_T_D) {
        MVar13 = MIR_DMOV;
      }
      else {
        MVar13 = (uint)(t == MIR_T_LD) * 3;
      }
      ctx = c2m_ctx->ctx;
    }
    else if (code == MIR_INSN_BOUND) {
      ctx = c2m_ctx->ctx;
    }
    else if (MVar13 == MIR_INSN_BOUND) {
      ctx = c2m_ctx->ctx;
      MVar13 = code;
    }
    else {
      get_new_temp(&local_78,c2m_ctx,MIR_T_I64);
      pMVar10 = MIR_new_insn(c2m_ctx->ctx,code);
      emit_insn_opt(c2m_ctx,pMVar10);
      ctx = c2m_ctx->ctx;
    }
    pMVar10 = MIR_new_insn(ctx,MVar13);
    emit_insn_opt(c2m_ctx,pMVar10);
  }
  uVar1 = *(undefined8 *)&__return_storage_ptr___00->field_0x8;
  pvVar2 = (__return_storage_ptr___00->mir_op).data;
  uVar3 = *(undefined8 *)&(__return_storage_ptr___00->mir_op).field_0x8;
  iVar4 = (__return_storage_ptr___00->mir_op).u.i;
  pcVar5 = (__return_storage_ptr___00->mir_op).u.str.s;
  uVar6 = *(undefined8 *)((long)&(__return_storage_ptr___00->mir_op).u + 0x10);
  MVar7 = (__return_storage_ptr___00->mir_op).u.mem.disp;
  __return_storage_ptr__->decl = __return_storage_ptr___00->decl;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = uVar1;
  (__return_storage_ptr__->mir_op).data = pvVar2;
  *(undefined8 *)&(__return_storage_ptr__->mir_op).field_0x8 = uVar3;
  (__return_storage_ptr__->mir_op).u.i = iVar4;
  (__return_storage_ptr__->mir_op).u.str.s = pcVar5;
  *(undefined8 *)((long)&(__return_storage_ptr__->mir_op).u + 0x10) = uVar6;
  (__return_storage_ptr__->mir_op).u.mem.disp = MVar7;
  return __return_storage_ptr__;
}

Assistant:

static op_t cast (c2m_ctx_t c2m_ctx, op_t op, MIR_type_t t, int new_op_p) {
  op_t res, interm;
  MIR_type_t op_type;
  MIR_insn_code_t insn_code = MIR_INSN_BOUND, insn_code2 = MIR_INSN_BOUND;

  assert (t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16 || t == MIR_T_I32
          || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64 || t == MIR_T_F || t == MIR_T_D
          || t == MIR_T_LD);
  switch (op.mir_op.mode) {
  case MIR_OP_MEM:
    op_type = op.mir_op.u.mem.type;
    if (op_type == MIR_T_UNDEF) { /* ??? it is an array */

    } else if (op_type == MIR_T_I8 || op_type == MIR_T_U8 || op_type == MIR_T_I16
               || op_type == MIR_T_U16 || op_type == MIR_T_I32 || op_type == MIR_T_U32)
      op_type = MIR_T_I64;
    goto all_types;
  case MIR_OP_REG:
    op_type = reg_type (c2m_ctx, op.mir_op.u.reg);
  all_types:
    if (op_type == MIR_T_F) goto float_val;
    if (op_type == MIR_T_D) goto double_val;
    if (op_type == MIR_T_LD) goto ldouble_val;
    if (t == MIR_T_I64) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                   : op_type == MIR_T_F   ? MIR_F2I
                   : op_type == MIR_T_D   ? MIR_D2I
                   : op_type == MIR_T_LD  ? MIR_LD2I
                                          : MIR_INSN_BOUND);
    } else if (t == MIR_T_U64) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                   : op_type == MIR_T_F   ? MIR_F2I
                   : op_type == MIR_T_D   ? MIR_D2I
                   : op_type == MIR_T_LD  ? MIR_LD2I
                                          : MIR_INSN_BOUND);
    } else if (t == MIR_T_I32) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
    } else if (t == MIR_T_U32) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
    } else if (t == MIR_T_I16) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
      insn_code2 = MIR_EXT16;
    } else if (t == MIR_T_U16) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
      insn_code2 = MIR_UEXT16;
    } else if (t == MIR_T_I8) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
      insn_code2 = MIR_EXT8;
    } else if (t == MIR_T_U8) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
      insn_code2 = MIR_UEXT8;
    } else if (t == MIR_T_F) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                                          : MIR_INSN_BOUND);
      insn_code2 = (op_type == MIR_T_I64 || op_type == MIR_T_I32   ? MIR_I2F
                    : op_type == MIR_T_U64 || op_type == MIR_T_U32 ? MIR_UI2F
                                                                   : MIR_INSN_BOUND);
    } else if (t == MIR_T_D) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                                          : MIR_INSN_BOUND);
      insn_code2 = (op_type == MIR_T_I64 || op_type == MIR_T_I32   ? MIR_I2D
                    : op_type == MIR_T_U64 || op_type == MIR_T_U32 ? MIR_UI2D
                                                                   : MIR_INSN_BOUND);
    } else if (t == MIR_T_LD) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                                          : MIR_INSN_BOUND);
      insn_code2 = (op_type == MIR_T_I64 || op_type == MIR_T_I32   ? MIR_I2LD
                    : op_type == MIR_T_U64 || op_type == MIR_T_U32 ? MIR_UI2LD
                                                                   : MIR_INSN_BOUND);
    }
    break;
  case MIR_OP_INT:
    insn_code = (t == MIR_T_I8    ? MIR_EXT8
                 : t == MIR_T_U8  ? MIR_UEXT8
                 : t == MIR_T_I16 ? MIR_EXT16
                 : t == MIR_T_U16 ? MIR_UEXT16
                 : t == MIR_T_F   ? MIR_I2F
                 : t == MIR_T_D   ? MIR_I2D
                 : t == MIR_T_LD  ? MIR_I2LD
                                  : MIR_INSN_BOUND);
    break;
  case MIR_OP_UINT:
    insn_code = (t == MIR_T_I8    ? MIR_EXT8
                 : t == MIR_T_U8  ? MIR_UEXT8
                 : t == MIR_T_I16 ? MIR_EXT16
                 : t == MIR_T_U16 ? MIR_UEXT16
                 : t == MIR_T_F   ? MIR_UI2F
                 : t == MIR_T_D   ? MIR_UI2D
                 : t == MIR_T_LD  ? MIR_UI2LD
                                  : MIR_INSN_BOUND);
    break;
  case MIR_OP_FLOAT:
  float_val:
    insn_code = (t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16
                     || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64
                   ? MIR_F2I
                 : t == MIR_T_D  ? MIR_F2D
                 : t == MIR_T_LD ? MIR_F2LD
                                 : MIR_INSN_BOUND);
    insn_code2 = (t == MIR_T_I8    ? MIR_EXT8
                  : t == MIR_T_U8  ? MIR_UEXT8
                  : t == MIR_T_I16 ? MIR_EXT16
                  : t == MIR_T_U16 ? MIR_UEXT16
                                   : MIR_INSN_BOUND);
    break;
  case MIR_OP_DOUBLE:
  double_val:
    insn_code = (t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16
                     || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64
                   ? MIR_D2I
                 : t == MIR_T_F  ? MIR_D2F
                 : t == MIR_T_LD ? MIR_D2LD
                                 : MIR_INSN_BOUND);
    insn_code2 = (t == MIR_T_I8    ? MIR_EXT8
                  : t == MIR_T_U8  ? MIR_UEXT8
                  : t == MIR_T_I16 ? MIR_EXT16
                  : t == MIR_T_U16 ? MIR_UEXT16
                                   : MIR_INSN_BOUND);
    break;
  case MIR_OP_LDOUBLE:
  ldouble_val:
    insn_code = (t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16
                     || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64
                   ? MIR_LD2I
                 : t == MIR_T_F ? MIR_LD2F
                 : t == MIR_T_D ? MIR_LD2D
                                : MIR_INSN_BOUND);
    insn_code2 = (t == MIR_T_I8    ? MIR_EXT8
                  : t == MIR_T_U8  ? MIR_UEXT8
                  : t == MIR_T_I16 ? MIR_EXT16
                  : t == MIR_T_U16 ? MIR_UEXT16
                                   : MIR_INSN_BOUND);
    break;
  default: break;
  }
  if (!new_op_p && insn_code == MIR_INSN_BOUND && insn_code2 == MIR_INSN_BOUND) return op;
  res = get_new_temp (c2m_ctx, t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16
                                 ? MIR_T_I64
                                 : t);
  if (insn_code == MIR_INSN_BOUND && insn_code2 == MIR_INSN_BOUND) {
    emit2 (c2m_ctx, tp_mov (t), res.mir_op, op.mir_op);
  } else if (insn_code == MIR_INSN_BOUND) {
    emit2 (c2m_ctx, insn_code2, res.mir_op, op.mir_op);
  } else if (insn_code2 == MIR_INSN_BOUND) {
    emit2 (c2m_ctx, insn_code, res.mir_op, op.mir_op);
  } else {
    interm = get_new_temp (c2m_ctx, MIR_T_I64);
    emit2 (c2m_ctx, insn_code, interm.mir_op, op.mir_op);
    emit2 (c2m_ctx, insn_code2, res.mir_op, interm.mir_op);
  }
  return res;
}